

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O0

void __thiscall cubeb_resampler_drain_Test::TestBody(cubeb_resampler_drain_Test *this)

{
  bool bVar1;
  long lVar2;
  char *message;
  AssertionResult gtest_ar;
  long got;
  float out_buffer [128];
  long out_frames;
  cubeb_resampler *resampler;
  int cb_count;
  int target_rate;
  cubeb_stream_params output_params;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffd7c;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffd84;
  int *in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  uint uVar5;
  AssertHelper in_stack_fffffffffffffd98;
  uint in_stack_fffffffffffffda4;
  undefined4 in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdac;
  cubeb_stream_params *in_stack_fffffffffffffdb0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffdb8;
  cubeb_resampler_quality in_stack_fffffffffffffdd0;
  cubeb_resampler_reclock in_stack_fffffffffffffdd8;
  
  uVar3 = 0;
  uVar4 = 0;
  cubeb_resampler_create
            ((cubeb_stream *)in_stack_fffffffffffffdb8.ptr_,in_stack_fffffffffffffdb0,
             (cubeb_stream_params *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
             in_stack_fffffffffffffda4,(cubeb_data_callback)in_stack_fffffffffffffd98.data_,
             (void *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
             in_stack_fffffffffffffdd0,in_stack_fffffffffffffdd8);
  do {
    lVar2 = cubeb_resampler_fill
                      ((cubeb_resampler *)
                       CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                       in_stack_fffffffffffffd88,(long *)CONCAT44(in_stack_fffffffffffffd84,uVar4),
                       (void *)CONCAT44(in_stack_fffffffffffffd7c,uVar3),0x10aa74);
  } while (lVar2 == 0x80);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)in_stack_fffffffffffffd98.data_,
             (char *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
             in_stack_fffffffffffffd88,(int *)CONCAT44(in_stack_fffffffffffffd84,uVar4));
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffdb0);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
    message = testing::AssertionResult::failure_message((AssertionResult *)0x10aad7);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffd98,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
               ,0x21d,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffd98,(Message *)&stack0xfffffffffffffda0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffd98);
    testing::Message::~Message((Message *)0x10ab18);
  }
  uVar5 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10ab34);
  if (uVar5 == 0) {
    cubeb_resampler_destroy((cubeb_resampler *)CONCAT44(in_stack_fffffffffffffd84,uVar4));
  }
  return;
}

Assistant:

TEST(cubeb, resampler_drain)
{
  cubeb_stream_params output_params;
  int target_rate;

  output_params.rate = 44100;
  output_params.channels = 1;
  output_params.format = CUBEB_SAMPLE_FLOAT32NE;
  target_rate = 48000;
  int cb_count = 0;

  cubeb_resampler * resampler =
    cubeb_resampler_create((cubeb_stream*)nullptr, nullptr, &output_params, target_rate,
                           test_drain_data_cb, &cb_count,
                           CUBEB_RESAMPLER_QUALITY_VOIP,
                           CUBEB_RESAMPLER_RECLOCK_NONE);

  const long out_frames = 128;
  float out_buffer[out_frames];
  long got;

  do {
    got = cubeb_resampler_fill(resampler, nullptr, nullptr,
                               out_buffer, out_frames);
  } while (got == out_frames);

  /* The callback should be called once but not again after returning <
   * frame_count. */
  ASSERT_EQ(cb_count, 1);

  cubeb_resampler_destroy(resampler);
}